

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

base_learner * print_setup(options_i *options,vw *all)

{
  typed_option<bool> *dat;
  pointer ppVar1;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<print,_example> *ret;
  free_ptr<print> p;
  option_group_definition new_options;
  bool print_option;
  string *in_stack_fffffffffffffe28;
  typed_option<bool> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  typed_option<bool> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  typed_option<bool> local_130;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  vw *local_18;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_19 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Print psuedolearner",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"print",&local_151);
  VW::config::make_option<bool>(in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30);
  VW::config::typed_option<bool>::keep(&local_130,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"print examples",(allocator *)&stack0xfffffffffffffe87);
  dat = VW::config::typed_option<bool>::help(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  (**(code **)*local_10)(local_10,local_58);
  if ((local_19 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    scoped_calloc_or_throw<print>();
    ppVar1 = std::unique_ptr<print,_void_(*)(void_*)>::operator->
                       ((unique_ptr<print,_void_(*)(void_*)> *)0x2872c3);
    ppVar1->all = local_18;
    parameters::stride_shift
              ((parameters *)in_stack_fffffffffffffe30,
               (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    in_stack_fffffffffffffe30 =
         (typed_option<bool> *)
         LEARNER::init_learner<print,example,LEARNER::learner<char,char>>
                   ((free_ptr<print> *)dat,
                    (_func_void_print_ptr_learner<char,_char>_ptr_example_ptr *)local_18,
                    (_func_void_print_ptr_learner<char,_char>_ptr_example_ptr *)
                    in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    local_8 = LEARNER::make_base<print,example>
                        ((learner<print,_example> *)in_stack_fffffffffffffe30);
    std::unique_ptr<print,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<print,_void_(*)(void_*)> *)dat);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe30);
  return local_8;
}

Assistant:

LEARNER::base_learner* print_setup(options_i& options, vw& all)
{
  bool print_option = false;
  option_group_definition new_options("Print psuedolearner");
  new_options.add(make_option("print", print_option).keep().help("print examples"));
  options.add_and_parse(new_options);

  if (!print_option)
    return nullptr;

  auto p = scoped_calloc_or_throw<print>();
  p->all = &all;

  all.weights.stride_shift(0);

  LEARNER::learner<print, example>& ret = init_learner(p, learn, learn, 1);
  return make_base(ret);
}